

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_loadfile(lua_State *L)

{
  int iVar1;
  GCstr *local_48;
  GCstr *local_38;
  int status;
  GCstr *mode;
  GCstr *fname;
  lua_State *L_local;
  
  local_38 = lj_lib_optstr(L,1);
  local_48 = lj_lib_optstr(L,2);
  lua_settop(L,3);
  if (local_38 == (GCstr *)0x0) {
    local_38 = (GCstr *)0x0;
  }
  else {
    local_38 = local_38 + 1;
  }
  if (local_48 == (GCstr *)0x0) {
    local_48 = (GCstr *)0x0;
  }
  else {
    local_48 = local_48 + 1;
  }
  iVar1 = luaL_loadfilex(L,(char *)local_38,(char *)local_48);
  iVar1 = load_aux(L,iVar1,3);
  return iVar1;
}

Assistant:

LJLIB_CF(loadfile)
{
  GCstr *fname = lj_lib_optstr(L, 1);
  GCstr *mode = lj_lib_optstr(L, 2);
  int status;
  lua_settop(L, 3);  /* Ensure env arg exists. */
  status = luaL_loadfilex(L, fname ? strdata(fname) : NULL,
			  mode ? strdata(mode) : NULL);
  return load_aux(L, status, 3);
}